

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O1

bool __thiscall
FIX::double_conversion::FastDtoa
          (double_conversion *this,double v,FastDtoaMode mode,int requested_digits,
          Vector<char> buffer,int *length,int *decimal_point)

{
  FastDtoaMode FVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  FastDtoaMode FVar7;
  int iVar8;
  undefined4 in_register_00000014;
  double_conversion *this_00;
  ulong uVar9;
  ulong uVar10;
  int *piVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  uint64_t uVar19;
  ulong uVar20;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  DiyFp DVar21;
  int *kappa;
  uint64_t in_stack_fffffffffffffee8;
  uint local_fc;
  DiyFp boundary_plus;
  DiyFp ten_mk_1;
  DiyFp local_c0;
  ulong local_b0;
  DiyFp boundary_minus;
  int local_8c;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  int *local_70;
  uint64_t local_68;
  ulong local_60;
  uint local_54;
  DiyFp ten_mk;
  DiyFp too_low;
  
  this_00 = (double_conversion *)CONCAT44(in_register_00000014,requested_digits);
  piVar11 = buffer._8_8_;
  uVar6 = (uint)buffer.start_;
  if (v <= 0.0) {
    __assert_fail("v > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                  ,0x281,
                  "bool FIX::double_conversion::FastDtoa(double, FastDtoaMode, int, Vector<char>, int *, int *)"
                 );
  }
  if (v == INFINITY) {
    __assert_fail("!Double(v).IsSpecial()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                  ,0x282,
                  "bool FIX::double_conversion::FastDtoa(double, FastDtoaMode, int, Vector<char>, int *, int *)"
                 );
  }
  uVar17 = (uint)this;
  ten_mk_1.f_ = (uint64_t)v;
  local_70 = length;
  if (1 < uVar17) {
    if (uVar17 != 2) {
      abort();
    }
    DVar21 = Double::AsNormalizedDiyFp((Double *)&ten_mk_1);
    iVar4 = DVar21.e_;
    ten_mk_1.f_ = 0;
    ten_mk_1.e_ = 0;
    PowersOfTenCache::GetCachedPowerForBinaryExponentRange
              (-0x7c - iVar4,-0x60 - iVar4,&ten_mk_1,(int *)&boundary_minus);
    if (0x1c < ten_mk_1.e_ + iVar4 + 0x7cU) {
      __assert_fail("(kMinimalTargetExponent <= w.e() + ten_mk.e() + DiyFp::kSignificandSize) && (kMaximalTargetExponent >= w.e() + ten_mk.e() + DiyFp::kSignificandSize)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x262,
                    "bool FIX::double_conversion::Grisu3Counted(double, int, Vector<char>, int *, int *)"
                   );
    }
    uVar17 = ten_mk_1.e_ + iVar4;
    uVar9 = DVar21.f_ >> 0x20;
    uVar12 = (ten_mk_1.f_ & 0xffffffff) * uVar9;
    uVar13 = DVar21.f_ & 0xffffffff;
    uVar10 = (ten_mk_1.f_ >> 0x20) * uVar13;
    bVar5 = -(char)uVar17;
    uVar19 = 1L << (bVar5 & 0x3f);
    uVar12 = ((uVar10 & 0xffffffff) +
              ((ten_mk_1.f_ & 0xffffffff) * uVar13 >> 0x20) + (uVar12 & 0xffffffff) + 0x80000000 >>
             0x20) + (uVar10 >> 0x20) + uVar9 * (ten_mk_1.f_ >> 0x20) + (uVar12 >> 0x20);
    uVar10 = uVar12 >> (bVar5 & 0x3f);
    kappa = (int *)0x16e329;
    BiggestPowerTen((uint32_t)uVar10,uVar17 + 0x80,(uint32_t *)&local_c0,(int *)&too_low);
    *piVar11 = 0;
    uVar9 = local_c0.f_ & 0xffffffff;
    FVar7 = mode;
    iVar4 = (int)too_low.f_;
    if (0 < (int)too_low.f_) {
      iVar4 = (int)too_low.f_ - mode;
      FVar7 = mode - (int)too_low.f_;
      iVar16 = mode - FAST_DTOA_SHORTEST_SINGLE;
      iVar8 = (int)too_low.f_;
      do {
        uVar13 = (uVar10 & 0xffffffff) / uVar9;
        uVar10 = (uVar10 & 0xffffffff) % uVar9;
        if (9 < (int)uVar13) {
          boundary_plus.f_ = CONCAT44(boundary_plus.f_._4_4_,iVar8);
          local_c0.f_ = CONCAT44(local_c0.f_._4_4_,(int)uVar9);
          __assert_fail("digit <= 9",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                        ,0x1cd,
                        "bool FIX::double_conversion::DigitGenCounted(DiyFp, int, Vector<char>, int *, int *)"
                       );
        }
        iVar2 = *piVar11;
        if (((long)iVar2 < 0) || ((int)uVar6 <= iVar2)) {
          boundary_plus.f_ = CONCAT44(boundary_plus.f_._4_4_,iVar8);
          local_c0.f_ = CONCAT44(local_c0.f_._4_4_,(int)uVar9);
          goto LAB_0016ea26;
        }
        this_00[iVar2] = (double_conversion)((char)uVar13 + '0');
        *piVar11 = *piVar11 + 1;
        bVar3 = iVar16 == 0;
        iVar16 = iVar16 + -1;
        if (bVar3) {
          FVar7 = FAST_DTOA_SHORTEST;
          goto LAB_0016e859;
        }
        uVar9 = uVar9 / 10;
        bVar3 = 1 < iVar8;
        iVar8 = iVar8 + -1;
      } while (bVar3);
      iVar4 = 0;
    }
LAB_0016e859:
    boundary_plus.f_ = CONCAT44(boundary_plus.f_._4_4_,iVar4);
    bVar5 = -(char)uVar17 - 0x40;
    uVar12 = uVar12 & uVar19 - 1;
    local_c0.f_ = CONCAT44(local_c0.f_._4_4_,(int)uVar9);
    if (FVar7 == FAST_DTOA_SHORTEST) {
      iVar8 = (int)((uVar10 & 0xffffffff) << (bVar5 & 0x3f)) + (int)uVar12;
      iVar4 = *piVar11;
      uVar19 = uVar9 << (bVar5 & 0x3f);
      uVar10 = 1;
LAB_0016e93f:
      buffer_02.start_ = (ulong)uVar6;
      buffer_02.length_ = iVar4;
      buffer_02._12_4_ = 0;
      bVar3 = RoundWeedCounted(this_00,buffer_02,iVar8,uVar19,uVar10,(uint64_t)&boundary_plus,kappa)
      ;
      uVar10 = (ulong)bVar3;
    }
    else {
      if (uVar17 < 0xffffff84) {
        __assert_fail("(((static_cast<uint64_t>(0xFFFFFFFF) << 32) + 0xFFFFFFFFu)) / 10 >= one.f()",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                      ,0x1e9,
                      "bool FIX::double_conversion::DigitGenCounted(DiyFp, int, Vector<char>, int *, int *)"
                     );
      }
      uVar10 = 1;
      bVar3 = false;
      if ((0 < (int)FVar7) && (bVar3 = false, 1 < uVar12)) {
        do {
          uVar9 = uVar12 * 10 >> (bVar5 & 0x3f);
          if (9 < (int)uVar9) {
            boundary_plus.f_ = CONCAT44(boundary_plus.f_._4_4_,iVar4);
            __assert_fail("digit <= 9",
                          "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                          ,0x1ef,
                          "bool FIX::double_conversion::DigitGenCounted(DiyFp, int, Vector<char>, int *, int *)"
                         );
          }
          iVar8 = *piVar11;
          if (((long)iVar8 < 0) || ((int)uVar6 <= iVar8)) {
            boundary_plus.f_ = CONCAT44(boundary_plus.f_._4_4_,iVar4);
            goto LAB_0016ea26;
          }
          uVar10 = uVar10 * 10;
          this_00[iVar8] = (double_conversion)((char)uVar9 + '0');
          *piVar11 = *piVar11 + 1;
          FVar1 = FVar7 - FAST_DTOA_SHORTEST_SINGLE;
          uVar12 = uVar12 * 10 & uVar19 - 1;
          iVar4 = iVar4 + -1;
        } while ((1 < (int)FVar7) && (FVar7 = FVar1, uVar10 < uVar12));
        boundary_plus.f_ = CONCAT44(boundary_plus.f_._4_4_,iVar4);
        bVar3 = FVar1 == FAST_DTOA_SHORTEST;
      }
      if (bVar3) {
        iVar4 = *piVar11;
        iVar8 = (int)uVar12;
        goto LAB_0016e93f;
      }
      uVar10 = 0;
    }
    local_8c = (int)boundary_plus.f_ - (int)boundary_minus.f_;
    goto LAB_0016e960;
  }
  DVar21 = Double::AsNormalizedDiyFp((Double *)&ten_mk_1);
  iVar4 = DVar21.e_;
  boundary_minus.f_ = 0;
  boundary_minus.e_ = 0;
  boundary_plus.f_ = 0;
  boundary_plus.e_ = 0;
  if (uVar17 == 1) {
    ten_mk_1.f_ = CONCAT44(ten_mk_1.f_._4_4_,(float)v);
    Single::NormalizedBoundaries((Single *)&ten_mk_1,&boundary_minus,&boundary_plus);
  }
  else {
    if (uVar17 != 0) {
      __assert_fail("mode == FAST_DTOA_SHORTEST_SINGLE",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x215,
                    "bool FIX::double_conversion::Grisu3(double, FastDtoaMode, Vector<char>, int *, int *)"
                   );
    }
    ten_mk_1.f_ = (uint64_t)v;
    Double::NormalizedBoundaries((Double *)&ten_mk_1,&boundary_minus,&boundary_plus);
  }
  if (boundary_plus.e_ != iVar4) {
    __assert_fail("boundary_plus.e() == w.e()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                  ,0x219,
                  "bool FIX::double_conversion::Grisu3(double, FastDtoaMode, Vector<char>, int *, int *)"
                 );
  }
  ten_mk.f_ = 0;
  ten_mk.e_ = 0;
  PowersOfTenCache::GetCachedPowerForBinaryExponentRange
            (-0x7c - iVar4,-0x60 - iVar4,&ten_mk,&local_8c);
  if (0x1c < iVar4 + ten_mk.e_ + 0x7cU) {
    __assert_fail("(kMinimalTargetExponent <= w.e() + ten_mk.e() + DiyFp::kSignificandSize) && (kMaximalTargetExponent >= w.e() + ten_mk.e() + DiyFp::kSignificandSize)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                  ,0x227,
                  "bool FIX::double_conversion::Grisu3(double, FastDtoaMode, Vector<char>, int *, int *)"
                 );
  }
  if (iVar4 != boundary_plus.e_) {
    __assert_fail("scaled_w.e() == boundary_plus.e() + ten_mk.e() + DiyFp::kSignificandSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                  ,0x233,
                  "bool FIX::double_conversion::Grisu3(double, FastDtoaMode, Vector<char>, int *, int *)"
                 );
  }
  local_c0.e_ = ten_mk.e_ + iVar4 + 0x40;
  uVar9 = ten_mk.f_ & 0xffffffff;
  uVar12 = DVar21.f_ >> 0x20;
  uVar13 = uVar9 * uVar12;
  uVar10 = ten_mk.f_ >> 0x20;
  uVar20 = DVar21.f_ & 0xffffffff;
  uVar15 = uVar10 * uVar20;
  local_c0.f_ = ((uVar15 & 0xffffffff) + (uVar20 * uVar9 >> 0x20) + (uVar13 & 0xffffffff) +
                 0x80000000 >> 0x20) + (uVar15 >> 0x20) + uVar12 * uVar10 + (uVar13 >> 0x20);
  if (boundary_minus.e_ != iVar4) {
    __assert_fail("low.e() == w.e() && w.e() == high.e()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                  ,0x132,
                  "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                 );
  }
  uVar12 = (boundary_minus.f_ & 0xffffffff) * uVar10;
  uVar13 = (boundary_minus.f_ >> 0x20) * uVar9;
  lVar14 = ((uVar12 & 0xffffffff) +
            (uVar13 & 0xffffffff) + ((boundary_minus.f_ & 0xffffffff) * uVar9 >> 0x20) + 0x80000000
           >> 0x20) + (uVar12 >> 0x20) + (uVar13 >> 0x20) + (boundary_minus.f_ >> 0x20) * uVar10;
  uVar12 = uVar10 * (boundary_plus.f_ & 0xffffffff);
  uVar13 = (boundary_plus.f_ >> 0x20) * uVar9;
  lVar18 = ((uVar12 & 0xffffffff) +
            (uVar13 & 0xffffffff) + ((boundary_plus.f_ & 0xffffffff) * uVar9 >> 0x20) + 0x80000000
           >> 0x20) + (uVar12 >> 0x20) + (uVar13 >> 0x20) + (boundary_plus.f_ >> 0x20) * uVar10;
  if (lVar18 - 1U < lVar14 + 1U) {
    __assert_fail("low.f() + 1 <= high.f() - 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                  ,0x133,
                  "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                 );
  }
  if (0x1c < ten_mk.e_ + iVar4 + 0x7cU) {
    __assert_fail("kMinimalTargetExponent <= w.e() && w.e() <= kMaximalTargetExponent",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                  ,0x134,
                  "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                 );
  }
  iVar4 = ten_mk.e_ + boundary_plus.e_ + 0x40;
  too_low.e_ = boundary_minus.e_ + ten_mk.e_ + 0x40;
  too_low.f_ = lVar14 - 1;
  uVar13 = lVar18 + 1;
  ten_mk_1.f_ = uVar13;
  ten_mk_1.e_ = iVar4;
  DiyFp::Subtract(&ten_mk_1,&too_low);
  uVar12 = ten_mk_1.f_;
  local_78 = (ulong)(uint)local_c0.e_;
  local_b0 = (ulong)(uint)-local_c0.e_;
  bVar5 = (byte)-local_c0.e_;
  local_68 = 1L << (bVar5 & 0x3f);
  uVar9 = uVar13 >> (bVar5 & 0x3f);
  local_60 = local_68 - 1;
  uVar20 = local_60 & uVar13;
  uVar10 = (ulong)(local_c0.e_ + 0x40U);
  local_88 = uVar13;
  BiggestPowerTen((uint32_t)uVar9,local_c0.e_ + 0x40U,&local_fc,(int *)&local_54);
  *piVar11 = 0;
  local_80 = uVar12;
  uVar17 = local_54;
  do {
    uVar13 = local_88;
    if ((int)uVar17 < 1) {
      if ((int)local_78 < -0x3c) {
        __assert_fail("one.e() >= -60",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                      ,0x179,
                      "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                     );
      }
      if (0x3c < (uint)local_b0) {
        __assert_fail("(((static_cast<uint64_t>(0xFFFFFFFF) << 32) + 0xFFFFFFFFu)) / 10 >= one.f()",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                      ,0x17b,
                      "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                     );
      }
      uVar19 = 1;
      uVar9 = local_b0;
      uVar17 = (int)local_54 >> 0x1f & local_54;
      goto LAB_0016e77e;
    }
    uVar13 = (uVar9 & 0xffffffff) / (ulong)local_fc;
    uVar9 = (uVar9 & 0xffffffff) % (ulong)local_fc;
    if (9 < (int)uVar13) {
      __assert_fail("digit <= 9",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x15e,
                    "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                   );
    }
    iVar8 = *piVar11;
    if (((long)iVar8 < 0) || ((int)uVar6 <= iVar8)) goto LAB_0016ea26;
    this_00[iVar8] = (double_conversion)((char)uVar13 + '0');
    iVar8 = *piVar11;
    bVar5 = (byte)local_b0;
    *piVar11 = iVar8 + 1;
    uVar13 = (uVar9 << (bVar5 & 0x3f)) + uVar20;
    if (uVar13 < uVar12) {
      ten_mk_1.f_ = local_88;
      ten_mk_1.e_ = iVar4;
      DiyFp::Subtract(&ten_mk_1,&local_c0);
      buffer_00.start_ = (ulong)uVar6;
      buffer_00.length_ = iVar8 + 1;
      buffer_00._12_4_ = 0;
      bVar3 = RoundWeed(this_00,buffer_00,(int)ten_mk_1.f_,local_80,uVar13,
                        (ulong)local_fc << (bVar5 & 0x3f),1,in_stack_fffffffffffffee8);
      uVar10 = (ulong)bVar3;
      uVar12 = local_80;
    }
    else {
      local_fc = local_fc / 10;
    }
    uVar17 = uVar17 - 1;
  } while (uVar12 <= uVar13);
  goto LAB_0016e83c;
  while( true ) {
    uVar19 = uVar19 * 10;
    uVar12 = uVar12 * 10;
    this_00[iVar8] = (double_conversion)((char)uVar15 + '0');
    iVar8 = *piVar11;
    *piVar11 = iVar8 + 1;
    uVar20 = uVar20 * 10 & local_60;
    if (uVar20 < uVar12) {
      ten_mk_1.f_ = uVar13;
      ten_mk_1.e_ = iVar4;
      DiyFp::Subtract(&ten_mk_1,&local_c0);
      buffer_01.start_ = (ulong)uVar6;
      buffer_01.length_ = iVar8 + 1;
      buffer_01._12_4_ = 0;
      bVar3 = RoundWeed(this_00,buffer_01,(int)ten_mk_1.f_ * (int)uVar19,uVar12,uVar20,local_68,
                        uVar19,in_stack_fffffffffffffee8);
      uVar10 = (ulong)bVar3;
      uVar9 = local_b0;
    }
    uVar17 = uVar17 - 1;
    if (uVar20 < uVar12) break;
LAB_0016e77e:
    uVar15 = uVar20 * 10 >> ((byte)uVar9 & 0x3f);
    if (9 < (int)uVar15) {
      __assert_fail("digit <= 9",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                    ,0x182,
                    "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                   );
    }
    iVar8 = *piVar11;
    if (((long)iVar8 < 0) || ((int)uVar6 <= iVar8)) goto LAB_0016ea26;
  }
LAB_0016e83c:
  local_8c = uVar17 - local_8c;
LAB_0016e960:
  if ((uVar10 & 1) != 0) {
    *local_70 = local_8c + *piVar11;
    iVar4 = *piVar11;
    if (((long)iVar4 < 0) || ((int)uVar6 <= iVar4)) {
LAB_0016ea26:
      __assert_fail("0 <= index && index < length_",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                    ,0xcc,
                    "T &FIX::double_conversion::Vector<char>::operator[](int) const [T = char]");
    }
    this_00[iVar4] = (double_conversion)0x0;
  }
  return (bool)((byte)uVar10 & 1);
}

Assistant:

bool FastDtoa(double v,
              FastDtoaMode mode,
              int requested_digits,
              Vector<char> buffer,
              int* length,
              int* decimal_point) {
  ASSERT(v > 0);
  ASSERT(!Double(v).IsSpecial());

  bool result = false;
  int decimal_exponent = 0;
  switch (mode) {
    case FAST_DTOA_SHORTEST:
    case FAST_DTOA_SHORTEST_SINGLE:
      result = Grisu3(v, mode, buffer, length, &decimal_exponent);
      break;
    case FAST_DTOA_PRECISION:
      result = Grisu3Counted(v, requested_digits,
                             buffer, length, &decimal_exponent);
      break;
    default:
      UNREACHABLE();
  }
  if (result) {
    *decimal_point = *length + decimal_exponent;
    buffer[*length] = '\0';
  }
  return result;
}